

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicAtomicCase1CS::Run(BasicAtomicCase1CS *this)

{
  CallLogWrapper *this_00;
  uint uVar1;
  bool bVar2;
  GLuint GVar3;
  GLint location;
  void *pvVar4;
  GLuint i;
  long lVar5;
  long lVar6;
  char *format;
  allocator<char> local_59;
  GLuint unif [8];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)unif,
             "\nlayout(local_size_x = 4) in;\nlayout(std430, binding = 2) coherent buffer FSuint {\n  uint data[4];\n} g_uint_fs;\nlayout(std430, binding = 3) coherent buffer FSint {\n  int data[4];\n} g_int_fs;\nuniform uint g_uint_value[8];\nvoid main() {\n  if (atomicExchange(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[1]) != 0u) return;\n  if (atomicAdd(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[2]) != 1u) return;\n  if (atomicMin(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[1]) != 3u) return;\n  if (atomicMax(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[2]) != 1u) return;\n  if (atomicAnd(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[3]) != 2u) return;\n  if (atomicOr(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[4]) != 0u) return;\n  if (g_uint_value[0] > 0u) {\n    if (atomicXor(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[5]) != 3u) return;\n  }\n  if (atomicCompSwap(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[6], g_uint_value[7]) != 2u) {\n    g_uint_fs.data[gl_LocalInvocationIndex] = 1u;\n    return;\n  }\n  if (atomicExchange(g_int_fs.data[gl_LocalInvocationIndex], 1) != 0) return;\n  if (atomicAdd(g_int_fs.data[gl_LocalInvocationIndex], 2) != 1) return;\n  if (atomicMin(g_int_fs.data[gl_LocalInvocationIndex], 1) != 3) return;\n  if (atomicMax(g_int_fs.data[gl_LocalInvocationIndex], 2) != 1) return;\n  if (atomicAnd(g_int_fs.data[gl_LocalInvocationIndex], 0x1) != 2) return;\n  if (atomicOr(g_int_fs.data[gl_LocalInvocationIndex], 0x3) != 0) return;\n  if (atomicXor(g_int_fs.data[gl_LocalInvocationIndex], 0x1) != 3) return;\n  if (atomicCompSwap(g_int_fs.data[gl_LocalInvocationIndex], 0x2, 0x7) != 2) {\n    g_int_fs.data[gl_LocalInvocationIndex] = 1;\n    return;\n  }\n}"
             ,&local_59);
  GVar3 = ShaderStorageBufferObjectBase::CreateProgramCS
                    (&this->super_ShaderStorageBufferObjectBase,(string *)unif);
  this->m_program = GVar3;
  std::__cxx11::string::~string((string *)unif);
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  if (bVar2) {
    glu::CallLogWrapper::glGenBuffers(this_00,2,this->m_storage_buffer);
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      unif[0] = 0;
      unif[1] = 0;
      unif[2] = 0;
      unif[3] = 0;
      glu::CallLogWrapper::glBindBufferBase
                (this_00,0x90d2,(uint)lVar5 | 2,this->m_storage_buffer[lVar5]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,unif,0x88e8);
    }
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    unif[4] = 3;
    unif[5] = 1;
    unif[6] = 2;
    unif[7] = 7;
    unif[0] = 3;
    unif[1] = 1;
    unif[2] = 2;
    unif[3] = 1;
    location = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_uint_value[0]");
    glu::CallLogWrapper::glUniform1uiv(this_00,location,8,unif);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[0]);
    pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x10,1);
    lVar5 = -1;
    if (pvVar4 != (void *)0x0) {
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        uVar1 = *(uint *)((long)pvVar4 + lVar6 * 4);
        if (uVar1 != 7) {
          format = "uData at index %d is %d should be %d.\n";
          goto LAB_00a07130;
        }
      }
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[1]);
      pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x10,1);
      if (pvVar4 != (void *)0x0) {
        for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
          uVar1 = *(uint *)((long)pvVar4 + lVar6 * 4);
          if (uVar1 != 7) {
            format = "iData at index %d is %d should be %d.\n";
LAB_00a07130:
            anon_unknown_0::Output(format,lVar6,(ulong)uVar1,7);
            return -1;
          }
        }
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
        lVar5 = 0;
      }
    }
  }
  else {
    lVar5 = -1;
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "layout(std430, binding = 2) coherent buffer FSuint {" NL
			   "  uint data[4];" NL "} g_uint_fs;" NL "layout(std430, binding = 3) coherent buffer FSint {" NL
			   "  int data[4];" NL "} g_int_fs;" NL "uniform uint g_uint_value[8];" NL "void main() {" NL
			   "  if (atomicExchange(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[1]) != 0u) return;" NL
			   "  if (atomicAdd(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[2]) != 1u) return;" NL
			   "  if (atomicMin(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[1]) != 3u) return;" NL
			   "  if (atomicMax(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[2]) != 1u) return;" NL
			   "  if (atomicAnd(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[3]) != 2u) return;" NL
			   "  if (atomicOr(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[4]) != 0u) return;" NL
			   "  if (g_uint_value[0] > 0u) {" NL
			   "    if (atomicXor(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[5]) != 3u) return;" NL "  }" NL
			   "  if (atomicCompSwap(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[6], g_uint_value[7]) != 2u) "
			   "{" NL "    g_uint_fs.data[gl_LocalInvocationIndex] = 1u;" NL "    return;" NL "  }" NL
			   "  if (atomicExchange(g_int_fs.data[gl_LocalInvocationIndex], 1) != 0) return;" NL
			   "  if (atomicAdd(g_int_fs.data[gl_LocalInvocationIndex], 2) != 1) return;" NL
			   "  if (atomicMin(g_int_fs.data[gl_LocalInvocationIndex], 1) != 3) return;" NL
			   "  if (atomicMax(g_int_fs.data[gl_LocalInvocationIndex], 2) != 1) return;" NL
			   "  if (atomicAnd(g_int_fs.data[gl_LocalInvocationIndex], 0x1) != 2) return;" NL
			   "  if (atomicOr(g_int_fs.data[gl_LocalInvocationIndex], 0x3) != 0) return;" NL
			   "  if (atomicXor(g_int_fs.data[gl_LocalInvocationIndex], 0x1) != 3) return;" NL
			   "  if (atomicCompSwap(g_int_fs.data[gl_LocalInvocationIndex], 0x2, 0x7) != 2) {" NL
			   "    g_int_fs.data[gl_LocalInvocationIndex] = 1;" NL "    return;" NL "  }" NL "}";
		m_program = CreateProgramCS(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(2, m_storage_buffer);
		for (GLuint i = 0; i < 2; ++i)
		{
			const int data[4] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i + 2, m_storage_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}

		glUseProgram(m_program);
		GLuint unif[8] = { 3, 1, 2, 1, 3, 1, 2, 7 };
		glUniform1uiv(glGetUniformLocation(m_program, "g_uint_value[0]"), 8, unif);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* uint data */
		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			GLuint* data = (GLuint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 16, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (GLuint i = 0; i < 4; ++i)
			{
				if (data[i] != 7)
				{
					Output("uData at index %d is %d should be %d.\n", i, data[i], 7);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* int data */
		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			GLint* data = (GLint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 16, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (GLint i = 0; i < 4; ++i)
			{
				if (data[i] != 7)
				{
					Output("iData at index %d is %d should be %d.\n", i, data[i], 7);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		return NO_ERROR;
	}